

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O3

bool __thiscall Character::AddSpell(Character *this,short spell)

{
  size_t *psVar1;
  ESF *pEVar2;
  bool bVar3;
  ulong uVar4;
  _List_node_base *p_Var5;
  
  if (spell < 1) {
    return false;
  }
  pEVar2 = this->world->esf;
  uVar4 = ((long)(pEVar2->data).
                 super__Vector_base<ESF_Data_Base<ESF>,_std::allocator<ESF_Data_Base<ESF>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(pEVar2->data).
                 super__Vector_base<ESF_Data_Base<ESF>,_std::allocator<ESF_Data_Base<ESF>_>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5;
  if (uVar4 < (ushort)spell || uVar4 - (ushort)spell == 0) {
LAB_0011789b:
    bVar3 = false;
  }
  else {
    for (p_Var5 = (this->spells).super__List_base<Character_Spell,_std::allocator<Character_Spell>_>
                  ._M_impl._M_node.super__List_node_base._M_next;
        p_Var5 != (_List_node_base *)&this->spells; p_Var5 = p_Var5->_M_next) {
      if ((int)*(short *)&p_Var5[1]._M_next == (uint)(ushort)spell) {
        if (p_Var5 != (_List_node_base *)&this->spells) goto LAB_0011789b;
        break;
      }
    }
    p_Var5 = (_List_node_base *)operator_new(0x18);
    *(uint *)&p_Var5[1]._M_next = (uint)(ushort)spell;
    std::__detail::_List_node_base::_M_hook(p_Var5);
    psVar1 = &(this->spells).super__List_base<Character_Spell,_std::allocator<Character_Spell>_>.
              _M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
    CheckQuestRules(this);
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

bool Character::AddSpell(short spell)
{
	if (spell <= 0 || std::size_t(spell) >= this->world->esf->data.size())
		return false;

	if (this->HasSpell(spell))
		return false;

	this->spells.push_back(Character_Spell(spell, 0));

	this->CheckQuestRules();

	return true;
}